

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzgnames.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TZGNCore::formatGenericNonLocationName
          (TZGNCore *this,TimeZone *tz,UTimeZoneGenericNameType type,UDate date,UnicodeString *name)

{
  UBool UVar1;
  int8_t iVar2;
  int iVar3;
  int32_t iVar4;
  uint uVar5;
  undefined4 extraout_var;
  TimeZoneRule *pTVar7;
  uint uVar8;
  bool bVar9;
  UDate UVar10;
  long local_548;
  long local_538;
  long local_528;
  long local_518;
  int local_4e8;
  int local_4e4;
  int32_t sav1;
  int32_t raw1;
  TimeZone *goldenZone;
  UnicodeString goldenID;
  UChar idBuf [32];
  UnicodeString mzName;
  UnicodeString mzGenericName;
  UChar genNameBuf [128];
  UnicodeString stdName;
  UTimeZoneNameType stdNameType;
  UBool afterTrs;
  TimeZoneTransition after;
  undefined1 local_268 [7];
  UBool beforTrs;
  TimeZoneTransition before;
  BasicTimeZone *btz;
  TimeZone *tmptz;
  UChar tmpNameBuf [128];
  int32_t sav;
  int32_t raw;
  undefined1 local_128 [3];
  UBool useStandard;
  UErrorCode status;
  UnicodeString mzID;
  UChar mzIDBuf [32];
  UTimeZoneNameType nameType;
  ConstChar16Ptr local_88;
  undefined1 local_80 [8];
  UnicodeString tzID;
  UChar *uID;
  UnicodeString *name_local;
  UDate date_local;
  UTimeZoneGenericNameType type_local;
  TimeZone *tz_local;
  TZGNCore *this_local;
  TimeZoneRule *pTVar6;
  
  UnicodeString::setToBogus(name);
  tzID.fUnion._48_8_ = ZoneMeta::getCanonicalCLDRID(tz);
  if ((UChar *)tzID.fUnion._48_8_ == (UChar *)0x0) {
    return name;
  }
  ConstChar16Ptr::ConstChar16Ptr(&local_88,(char16_t *)tzID.fUnion._48_8_);
  UnicodeString::UnicodeString((UnicodeString *)local_80,'\x01',&local_88,-1);
  ConstChar16Ptr::~ConstChar16Ptr(&local_88);
  uVar8 = 8;
  if (type == UTZGNM_LONG) {
    uVar8 = 1;
  }
  (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[10])
            (this->fTimeZoneNames,local_80,(ulong)uVar8,name);
  UVar1 = UnicodeString::isEmpty(name);
  if (UVar1 == '\0') goto LAB_00248179;
  UnicodeString::UnicodeString
            ((UnicodeString *)local_128,mzID.fUnion.fStackFields.fBuffer + 0x17,0,0x20);
  (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[7])
            (date,this->fTimeZoneNames,local_80,local_128);
  UVar1 = UnicodeString::isEmpty((UnicodeString *)local_128);
  if (UVar1 == '\0') {
    raw = 0;
    bVar9 = false;
    (*(tz->super_UObject)._vptr_UObject[6])(date,tz,0,tmpNameBuf + 0x7e,tmpNameBuf + 0x7c,&raw);
    UVar1 = ::U_FAILURE(raw);
    if (UVar1 == '\0') {
      if (tmpNameBuf._248_4_ == 0) {
        bVar9 = true;
        iVar3 = (*(tz->super_UObject)._vptr_UObject[0xc])();
        pTVar6 = (TimeZoneRule *)CONCAT44(extraout_var,iVar3);
        before.fTo = (TimeZoneRule *)0x0;
        if (pTVar6 == (TimeZoneRule *)0x0) {
          local_518 = 0;
        }
        else {
          local_518 = __dynamic_cast(pTVar6,&TimeZone::typeinfo,&OlsonTimeZone::typeinfo,0);
        }
        if (local_518 == 0) {
          if (pTVar6 == (TimeZoneRule *)0x0) {
            local_528 = 0;
          }
          else {
            local_528 = __dynamic_cast(pTVar6,&TimeZone::typeinfo,&SimpleTimeZone::typeinfo,0);
          }
          if (local_528 != 0) goto LAB_002479fb;
          if (pTVar6 == (TimeZoneRule *)0x0) {
            local_538 = 0;
          }
          else {
            local_538 = __dynamic_cast(pTVar6,&TimeZone::typeinfo,&RuleBasedTimeZone::typeinfo,0);
          }
          if (local_538 != 0) goto LAB_002479fb;
          if (pTVar6 == (TimeZoneRule *)0x0) {
            local_548 = 0;
          }
          else {
            local_548 = __dynamic_cast(pTVar6,&TimeZone::typeinfo,&VTimeZone::typeinfo,0);
          }
          if (local_548 != 0) goto LAB_002479fb;
        }
        else {
LAB_002479fb:
          before.fTo = pTVar6;
        }
        if (before.fTo == (TimeZoneRule *)0x0) {
          (*(pTVar6->super_UObject)._vptr_UObject[6])
                    (date + -15897600000.0,pTVar6,0,tmpNameBuf + 0x7e,tmpNameBuf + 0x7c,&raw);
          if (tmpNameBuf._248_4_ == 0) {
            (*(pTVar6->super_UObject)._vptr_UObject[6])
                      (date + 15897600000.0,pTVar6,0,tmpNameBuf + 0x7e,tmpNameBuf + 0x7c,&raw);
            bVar9 = tmpNameBuf._248_4_ == 0;
          }
          else {
            bVar9 = false;
          }
          UVar1 = ::U_FAILURE(raw);
          if (UVar1 != '\0') {
            if (pTVar6 != (TimeZoneRule *)0x0) {
              (*(pTVar6->super_UObject)._vptr_UObject[1])();
            }
            goto LAB_0024815d;
          }
        }
        else {
          TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)local_268);
          iVar3 = (*((before.fTo)->super_UObject)._vptr_UObject[0xf])(date,before.fTo,1,local_268);
          after.fTo._7_1_ = (char)iVar3;
          if ((after.fTo._7_1_ == '\0') ||
             (UVar10 = TimeZoneTransition::getTime((TimeZoneTransition *)local_268),
             15897600000.0 <= date - UVar10)) {
LAB_00247b03:
            TimeZoneTransition::TimeZoneTransition((TimeZoneTransition *)&stdNameType);
            iVar3 = (*((before.fTo)->super_UObject)._vptr_UObject[0xe])
                              (date,before.fTo,0,&stdNameType);
            if (((char)iVar3 != '\0') &&
               (UVar10 = TimeZoneTransition::getTime((TimeZoneTransition *)&stdNameType),
               UVar10 - date < 15897600000.0)) {
              pTVar7 = TimeZoneTransition::getTo((TimeZoneTransition *)&stdNameType);
              iVar4 = TimeZoneRule::getDSTSavings(pTVar7);
              if (iVar4 != 0) {
                bVar9 = false;
              }
            }
            TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)&stdNameType);
          }
          else {
            pTVar7 = TimeZoneTransition::getFrom((TimeZoneTransition *)local_268);
            iVar4 = TimeZoneRule::getDSTSavings(pTVar7);
            if (iVar4 == 0) goto LAB_00247b03;
            bVar9 = false;
          }
          TimeZoneTransition::~TimeZoneTransition((TimeZoneTransition *)local_268);
        }
        if (pTVar6 != (TimeZoneRule *)0x0) {
          (*(pTVar6->super_UObject)._vptr_UObject[1])();
        }
      }
      if (bVar9) {
        uVar5 = 0x10;
        if (uVar8 == 1) {
          uVar5 = 2;
        }
        UnicodeString::UnicodeString((UnicodeString *)(genNameBuf + 0x7c),(UChar *)&tmptz,0,0x80);
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[0xc])
                  (date,this->fTimeZoneNames,local_80,(ulong)uVar5,genNameBuf + 0x7c);
        UVar1 = UnicodeString::isEmpty((UnicodeString *)(genNameBuf + 0x7c));
        if (UVar1 == '\0') {
          UnicodeString::setTo(name,(UnicodeString *)(genNameBuf + 0x7c));
          UnicodeString::UnicodeString
                    ((UnicodeString *)((long)&mzName.fUnion + 0x30),
                     mzGenericName.fUnion.fStackFields.fBuffer + 0x17,0,0x80);
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                    (this->fTimeZoneNames,local_128,(ulong)uVar8,
                     (undefined1 *)((long)&mzName.fUnion + 0x30));
          iVar2 = UnicodeString::caseCompare
                            ((UnicodeString *)(genNameBuf + 0x7c),
                             (UnicodeString *)((long)&mzName.fUnion + 0x30),0);
          if (iVar2 == '\0') {
            UnicodeString::setToBogus(name);
          }
          UnicodeString::~UnicodeString((UnicodeString *)((long)&mzName.fUnion + 0x30));
        }
        UnicodeString::~UnicodeString((UnicodeString *)(genNameBuf + 0x7c));
      }
      UVar1 = UnicodeString::isEmpty(name);
      if (UVar1 != '\0') {
        UnicodeString::UnicodeString((UnicodeString *)(idBuf + 0x1c),(UChar *)&tmptz,0,0x80);
        (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[9])
                  (this->fTimeZoneNames,local_128,(ulong)uVar8,idBuf + 0x1c);
        UVar1 = UnicodeString::isEmpty((UnicodeString *)(idBuf + 0x1c));
        if (UVar1 == '\0') {
          UnicodeString::UnicodeString
                    ((UnicodeString *)&goldenZone,goldenID.fUnion.fStackFields.fBuffer + 0x17,0,0x20
                    );
          (*(this->fTimeZoneNames->super_UObject)._vptr_UObject[8])
                    (this->fTimeZoneNames,local_128,this->fTargetRegion,&goldenZone);
          UVar1 = UnicodeString::isEmpty((UnicodeString *)&goldenZone);
          if ((UVar1 == '\0') &&
             (UVar1 = UnicodeString::operator!=
                                ((UnicodeString *)&goldenZone,(UnicodeString *)local_80),
             UVar1 != '\0')) {
            _sav1 = TimeZone::createTimeZone((UnicodeString *)&goldenZone);
            (*(_sav1->super_UObject)._vptr_UObject[6])
                      (date + (double)(int)tmpNameBuf._252_4_ + (double)(int)tmpNameBuf._248_4_,
                       _sav1,1,&local_4e4,&local_4e8,&raw);
            if (_sav1 != (TimeZone *)0x0) {
              (*(_sav1->super_UObject)._vptr_UObject[1])();
            }
            UVar1 = ::U_SUCCESS(raw);
            if (UVar1 != '\0') {
              if ((tmpNameBuf._252_4_ == local_4e4) && (tmpNameBuf._248_4_ == local_4e8)) {
                UnicodeString::setTo(name,(UnicodeString *)(idBuf + 0x1c));
              }
              else {
                getPartialLocationName
                          (this,(UnicodeString *)local_80,(UnicodeString *)local_128,uVar8 == 1,
                           (UnicodeString *)(idBuf + 0x1c),name);
              }
            }
          }
          else {
            UnicodeString::setTo(name,(UnicodeString *)(idBuf + 0x1c));
          }
          UnicodeString::~UnicodeString((UnicodeString *)&goldenZone);
        }
        UnicodeString::~UnicodeString((UnicodeString *)(idBuf + 0x1c));
      }
    }
  }
LAB_0024815d:
  UnicodeString::~UnicodeString((UnicodeString *)local_128);
LAB_00248179:
  UnicodeString::~UnicodeString((UnicodeString *)local_80);
  return name;
}

Assistant:

UnicodeString&
TZGNCore::formatGenericNonLocationName(const TimeZone& tz, UTimeZoneGenericNameType type, UDate date, UnicodeString& name) const {
    U_ASSERT(type == UTZGNM_LONG || type == UTZGNM_SHORT);
    name.setToBogus();

    const UChar* uID = ZoneMeta::getCanonicalCLDRID(tz);
    if (uID == NULL) {
        return name;
    }

    UnicodeString tzID(TRUE, uID, -1);

    // Try to get a name from time zone first
    UTimeZoneNameType nameType = (type == UTZGNM_LONG) ? UTZNM_LONG_GENERIC : UTZNM_SHORT_GENERIC;
    fTimeZoneNames->getTimeZoneDisplayName(tzID, nameType, name);

    if (!name.isEmpty()) {
        return name;
    }

    // Try meta zone
    UChar mzIDBuf[32];
    UnicodeString mzID(mzIDBuf, 0, UPRV_LENGTHOF(mzIDBuf));
    fTimeZoneNames->getMetaZoneID(tzID, date, mzID);
    if (!mzID.isEmpty()) {
        UErrorCode status = U_ZERO_ERROR;
        UBool useStandard = FALSE;
        int32_t raw, sav;
        UChar tmpNameBuf[ZONE_NAME_U16_MAX];

        tz.getOffset(date, FALSE, raw, sav, status);
        if (U_FAILURE(status)) {
            return name;
        }

        if (sav == 0) {
            useStandard = TRUE;

            TimeZone *tmptz = tz.clone();
            // Check if the zone actually uses daylight saving time around the time
            BasicTimeZone *btz = NULL;
            if (dynamic_cast<OlsonTimeZone *>(tmptz) != NULL
                || dynamic_cast<SimpleTimeZone *>(tmptz) != NULL
                || dynamic_cast<RuleBasedTimeZone *>(tmptz) != NULL
                || dynamic_cast<VTimeZone *>(tmptz) != NULL) {
                btz = (BasicTimeZone*)tmptz;
            }

            if (btz != NULL) {
                TimeZoneTransition before;
                UBool beforTrs = btz->getPreviousTransition(date, TRUE, before);
                if (beforTrs
                        && (date - before.getTime() < kDstCheckRange)
                        && before.getFrom()->getDSTSavings() != 0) {
                    useStandard = FALSE;
                } else {
                    TimeZoneTransition after;
                    UBool afterTrs = btz->getNextTransition(date, FALSE, after);
                    if (afterTrs
                            && (after.getTime() - date < kDstCheckRange)
                            && after.getTo()->getDSTSavings() != 0) {
                        useStandard = FALSE;
                    }
                }
            } else {
                // If not BasicTimeZone... only if the instance is not an ICU's implementation.
                // We may get a wrong answer in edge case, but it should practically work OK.
                tmptz->getOffset(date - kDstCheckRange, FALSE, raw, sav, status);
                if (sav != 0) {
                    useStandard = FALSE;
                } else {
                    tmptz->getOffset(date + kDstCheckRange, FALSE, raw, sav, status);
                    if (sav != 0){
                        useStandard = FALSE;
                    }
                }
                if (U_FAILURE(status)) {
                    delete tmptz;
                    return name;
                }
            }
            delete tmptz;
        }
        if (useStandard) {
            UTimeZoneNameType stdNameType = (nameType == UTZNM_LONG_GENERIC)
                ? UTZNM_LONG_STANDARD : UTZNM_SHORT_STANDARD;
            UnicodeString stdName(tmpNameBuf, 0, UPRV_LENGTHOF(tmpNameBuf));
            fTimeZoneNames->getDisplayName(tzID, stdNameType, date, stdName);
            if (!stdName.isEmpty()) {
                name.setTo(stdName);

                // TODO: revisit this issue later
                // In CLDR, a same display name is used for both generic and standard
                // for some meta zones in some locales.  This looks like a data bugs.
                // For now, we check if the standard name is different from its generic
                // name below.
                UChar genNameBuf[ZONE_NAME_U16_MAX];
                UnicodeString mzGenericName(genNameBuf, 0, UPRV_LENGTHOF(genNameBuf));
                fTimeZoneNames->getMetaZoneDisplayName(mzID, nameType, mzGenericName);
                if (stdName.caseCompare(mzGenericName, 0) == 0) {
                    name.setToBogus();
                }
            }
        }
        if (name.isEmpty()) {
            // Get a name from meta zone
            UnicodeString mzName(tmpNameBuf, 0, UPRV_LENGTHOF(tmpNameBuf));
            fTimeZoneNames->getMetaZoneDisplayName(mzID, nameType, mzName);
            if (!mzName.isEmpty()) {
                // Check if we need to use a partial location format.
                // This check is done by comparing offset with the meta zone's
                // golden zone at the given date.
                UChar idBuf[32];
                UnicodeString goldenID(idBuf, 0, UPRV_LENGTHOF(idBuf));
                fTimeZoneNames->getReferenceZoneID(mzID, fTargetRegion, goldenID);
                if (!goldenID.isEmpty() && goldenID != tzID) {
                    TimeZone *goldenZone = TimeZone::createTimeZone(goldenID);
                    int32_t raw1, sav1;

                    // Check offset in the golden zone with wall time.
                    // With getOffset(date, false, offsets1),
                    // you may get incorrect results because of time overlap at DST->STD
                    // transition.
                    goldenZone->getOffset(date + raw + sav, TRUE, raw1, sav1, status);
                    delete goldenZone;
                    if (U_SUCCESS(status)) {
                        if (raw != raw1 || sav != sav1) {
                            // Now we need to use a partial location format
                            getPartialLocationName(tzID, mzID, (nameType == UTZNM_LONG_GENERIC), mzName, name);
                        } else {
                            name.setTo(mzName);
                        }
                    }
                } else {
                    name.setTo(mzName);
                }
            }
        }
    }
    return name;
}